

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall Rml::DataParser::VariableGetSet(DataParser *this,String *name,bool is_assignment)

{
  pointer pvVar1;
  pointer pvVar2;
  int local_6c;
  DataAddress address;
  InstructionData local_50;
  
  DataExpressionInterface::ParseAddress(&address,&this->expression_interface,name);
  if (address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    CreateString_abi_cxx11_
              ((String *)&local_50,"Could not find data variable with name \'%s\'.",
               (name->_M_dataplus)._M_p);
    Error(this,(String *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    pvVar1 = (this->variable_addresses).
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->variable_addresses).
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::
    vector<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,std::allocator<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
    ::emplace_back<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>
              ((vector<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,std::allocator<std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
                *)&this->variable_addresses,&address);
    local_50.instruction = Variable;
    if (is_assignment) {
      local_50.instruction = Assign;
    }
    local_6c = (int)(((long)pvVar2 - (long)pvVar1) / 0x18);
    Variant::Variant<int,void>(&local_50.data,&local_6c);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,&local_50);
    Variant::~Variant(&local_50.data);
  }
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&address);
  return;
}

Assistant:

void VariableGetSet(const String& name, bool is_assignment)
	{
		DataAddress address = expression_interface.ParseAddress(name);
		if (address.empty())
		{
			Error(CreateString("Could not find data variable with name '%s'.", name.c_str()));
			return;
		}
		int index = int(variable_addresses.size());
		variable_addresses.push_back(std::move(address));
		program.push_back(InstructionData{is_assignment ? Instruction::Assign : Instruction::Variable, Variant(int(index))});
	}